

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O2

UniquePtr<SSLAEADContext>
bssl::SSLAEADContext::Create
          (evp_aead_direction_t direction,uint16_t version,SSL_CIPHER *cipher,
          Span<const_unsigned_char> enc_key,Span<const_unsigned_char> mac_key,
          Span<const_unsigned_char> fixed_iv)

{
  byte bVar1;
  uint __line;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  __uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> _Var5;
  undefined6 in_register_00000032;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true> _Var6;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> _Var7;
  char *__assertion;
  uint8_t *key;
  size_t in_R9;
  Span<const_unsigned_char> in;
  uint16_t protocol_version;
  UniquePtr<SSLAEADContext> aead_ctx;
  EVP_AEAD *aead;
  SSL_CIPHER *cipher_local;
  ulong local_a8;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_a0;
  size_t expected_fixed_iv_len;
  size_t expected_mac_key_len;
  uint8_t merged_key [80];
  
  _Var6.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  _Var6.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl._0_4_ = direction;
  key = (uint8_t *)enc_key.size_;
  cipher_local = (SSL_CIPHER *)enc_key.data_;
  bVar2 = ssl_protocol_version_from_wire(&protocol_version,(uint16_t)cipher);
  if ((((bVar2) &&
       (bVar2 = ssl_cipher_get_evp_aead
                          (&aead,&expected_mac_key_len,&expected_fixed_iv_len,
                           (SSL_CIPHER *)enc_key.data_,protocol_version), bVar2)) &&
      (expected_fixed_iv_len == fixed_iv.size_)) && (expected_mac_key_len == mac_key.size_)) {
    aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
         (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
         New<bssl::SSLAEADContext,ssl_cipher_st_const*&>(&cipher_local);
    if ((tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
        aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bssl::SSLAEADContext_*,_false>)0x0) {
      *(undefined8 *)
       _Var6.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = 0;
    }
    else {
      sVar4 = EVP_AEAD_nonce_length(aead);
      if (0x20 < sVar4) {
        __assertion = "EVP_AEAD_nonce_length(aead) <= EVP_AEAD_MAX_NONCE_LENGTH";
        __line = 0x44;
        goto LAB_00147483;
      }
      sVar4 = EVP_AEAD_nonce_length(aead);
      *(char *)((long)aead_ctx._M_t.
                      super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl + 0x269) =
           (char)sVar4;
      if (expected_mac_key_len == 0) {
        in.size_ = expected_fixed_iv_len;
        in.data_ = fixed_iv.data_;
        InplaceVector<unsigned_char,_32UL>::CopyFrom
                  ((InplaceVector<unsigned_char,_32UL> *)
                   ((long)aead_ctx._M_t.
                          super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl + 0x248)
                   ,in);
        _Var7._M_head_impl = (SSLAEADContext *)aead_ctx;
        if ((protocol_version < 0x304) && ((cipher_local->algorithm_enc & 0x20) == 0)) {
          if (*(byte *)((long)aead_ctx._M_t.
                              super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>.
                              _M_t.
                              super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl +
                       0x269) < expected_fixed_iv_len) {
            __assertion = "fixed_iv.size() <= aead_ctx->variable_nonce_len_";
            __line = 0x55;
LAB_00147483:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                          ,__line,
                          "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                         );
          }
          if ((cipher_local->algorithm_enc & 0x18) == 0) {
            __assertion = "cipher->algorithm_enc & (SSL_AES128GCM | SSL_AES256GCM)";
            __line = 0x56;
            goto LAB_00147483;
          }
          *(byte *)((long)aead_ctx._M_t.
                          super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl + 0x269)
               = *(byte *)((long)aead_ctx._M_t.
                                 super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl
                          + 0x269) - (char)expected_fixed_iv_len;
          *(byte *)((long)aead_ctx._M_t.
                          super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl + 0x26a)
               = *(byte *)((long)aead_ctx._M_t.
                                 super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl
                          + 0x26a) | 1;
        }
        else {
          bVar1 = *(byte *)((long)aead_ctx._M_t.
                                  super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl
                           + 0x26a);
          *(byte *)((long)aead_ctx._M_t.
                          super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl + 0x26a)
               = bVar1 | 4;
          *(undefined1 *)
           ((long)aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>
                  ._M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl + 0x269) = 8;
          if (expected_fixed_iv_len < 8) {
            __assertion = "fixed_iv.size() >= aead_ctx->variable_nonce_len_";
            __line = 0x52;
            goto LAB_00147483;
          }
          if (0x303 < protocol_version) {
            *(byte *)((long)aead_ctx._M_t.
                            super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>.
                            _M_t.
                            super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl +
                     0x26a) = bVar1 | 0x14;
          }
        }
      }
      else {
        if (0x303 < protocol_version) {
          __assertion = "protocol_version < TLS1_3_VERSION";
          __line = 99;
          goto LAB_00147483;
        }
        local_a0._M_head_impl =
             (SSLAEADContext *)
             aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
        local_a8 = expected_fixed_iv_len + in_R9 + expected_mac_key_len;
        if (0x50 < local_a8) {
          abort();
        }
        memcpy(merged_key,mac_key.data_,expected_mac_key_len);
        if (in_R9 != 0) {
          memcpy(merged_key + expected_mac_key_len,key,in_R9);
        }
        if (expected_fixed_iv_len != 0) {
          memcpy(merged_key + expected_mac_key_len + in_R9,fixed_iv.data_,expected_fixed_iv_len);
        }
        *(byte *)((long)local_a0._M_head_impl + 0x26a) =
             *(byte *)((long)local_a0._M_head_impl + 0x26a) | 0xb;
        key = merged_key;
        in_R9 = local_a8;
        _Var7._M_head_impl = local_a0._M_head_impl;
      }
      iVar3 = EVP_AEAD_CTX_init_with_direction
                        ((EVP_AEAD_CTX *)((long)_Var7._M_head_impl + 8),aead,key,in_R9,0,
                         (evp_aead_direction_t)CONCAT62(in_register_00000032,version));
      _Var5._M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
           (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
           (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)aead_ctx;
      if (iVar3 == 0) {
        _Var5._M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>)0x0;
      }
      else {
        aead_ctx._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>)0x0;
      }
      *(tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter> *)
       _Var6.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
           _Var5._M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
    }
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(&aead_ctx);
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                  ,0x3a);
    *(undefined8 *)
     _Var6.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = 0;
  }
  return (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
         (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
         _Var6.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
}

Assistant:

UniquePtr<SSLAEADContext> SSLAEADContext::Create(
    enum evp_aead_direction_t direction, uint16_t version,
    const SSL_CIPHER *cipher, Span<const uint8_t> enc_key,
    Span<const uint8_t> mac_key, Span<const uint8_t> fixed_iv) {
  const EVP_AEAD *aead;
  uint16_t protocol_version;
  size_t expected_mac_key_len, expected_fixed_iv_len;
  if (!ssl_protocol_version_from_wire(&protocol_version, version) ||
      !ssl_cipher_get_evp_aead(&aead, &expected_mac_key_len,
                               &expected_fixed_iv_len, cipher,
                               protocol_version) ||
      // Ensure the caller returned correct key sizes.
      expected_fixed_iv_len != fixed_iv.size() ||
      expected_mac_key_len != mac_key.size()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return nullptr;
  }

  UniquePtr<SSLAEADContext> aead_ctx = MakeUnique<SSLAEADContext>(cipher);
  if (!aead_ctx) {
    return nullptr;
  }

  uint8_t merged_key[EVP_AEAD_MAX_KEY_LENGTH];
  assert(EVP_AEAD_nonce_length(aead) <= EVP_AEAD_MAX_NONCE_LENGTH);
  static_assert(EVP_AEAD_MAX_NONCE_LENGTH < 256,
                "variable_nonce_len doesn't fit in uint8_t");
  aead_ctx->variable_nonce_len_ = (uint8_t)EVP_AEAD_nonce_length(aead);
  if (mac_key.empty()) {
    // This is an actual AEAD.
    aead_ctx->fixed_nonce_.CopyFrom(fixed_iv);

    if (protocol_version >= TLS1_3_VERSION ||
        cipher->algorithm_enc & SSL_CHACHA20POLY1305) {
      // TLS 1.3, and TLS 1.2 ChaCha20-Poly1305, XOR the fixed IV with the
      // sequence number to form the nonce.
      aead_ctx->xor_fixed_nonce_ = true;
      aead_ctx->variable_nonce_len_ = 8;
      assert(fixed_iv.size() >= aead_ctx->variable_nonce_len_);
    } else {
      // TLS 1.2 AES-GCM prepends the fixed IV to an explicit nonce.
      assert(fixed_iv.size() <= aead_ctx->variable_nonce_len_);
      assert(cipher->algorithm_enc & (SSL_AES128GCM | SSL_AES256GCM));
      aead_ctx->variable_nonce_len_ -= fixed_iv.size();
      aead_ctx->variable_nonce_included_in_record_ = true;
    }

    // Starting TLS 1.3, the AAD is the whole record header.
    if (protocol_version >= TLS1_3_VERSION) {
      aead_ctx->ad_is_header_ = true;
    }
  } else {
    // This is a CBC cipher suite that implements the |EVP_AEAD| interface. The
    // |EVP_AEAD| takes the MAC key, encryption key, and fixed IV concatenated
    // as its input key.
    assert(protocol_version < TLS1_3_VERSION);
    BSSL_CHECK(mac_key.size() + enc_key.size() + fixed_iv.size() <=
               sizeof(merged_key));
    OPENSSL_memcpy(merged_key, mac_key.data(), mac_key.size());
    OPENSSL_memcpy(merged_key + mac_key.size(), enc_key.data(), enc_key.size());
    OPENSSL_memcpy(merged_key + mac_key.size() + enc_key.size(),
                   fixed_iv.data(), fixed_iv.size());
    enc_key =
        Span(merged_key, enc_key.size() + mac_key.size() + fixed_iv.size());

    // The |EVP_AEAD|'s per-encryption nonce, if any, is actually the CBC IV. It
    // must be generated randomly and prepended to the record.
    aead_ctx->variable_nonce_included_in_record_ = true;
    aead_ctx->random_variable_nonce_ = true;
    aead_ctx->omit_length_in_ad_ = true;
  }

  if (!EVP_AEAD_CTX_init_with_direction(
          aead_ctx->ctx_.get(), aead, enc_key.data(), enc_key.size(),
          EVP_AEAD_DEFAULT_TAG_LENGTH, direction)) {
    return nullptr;
  }

  return aead_ctx;
}